

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error split_sdf_cubic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  FT_Error FVar1;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  SDF_Edge_ *pSStack_b8;
  FT_26D6 threshold;
  SDF_Edge *right;
  SDF_Edge *left;
  FT_26D6_Vec cpos [7];
  FT_Error local_2c;
  FT_Error error;
  SDF_Edge **out_local;
  FT_UInt max_splits_local;
  FT_26D6_Vec *control_points_local;
  FT_Memory memory_local;
  
  if ((memory == (FT_Memory)0x0) || (out == (SDF_Edge **)0x0)) {
    return 6;
  }
  left = (SDF_Edge *)control_points->x;
  cpos[0].x = control_points->y;
  cpos[0].y = control_points[1].x;
  cpos[1].x = control_points[1].y;
  cpos[1].y = control_points[2].x;
  cpos[2].x = control_points[2].y;
  cpos[2].y = control_points[3].x;
  cpos[3].x = control_points[3].y;
  if ((long)left * 2 + cpos[0].y * -3 + cpos[2].y < 0) {
    local_c8 = -((long)left * 2 + cpos[0].y * -3 + cpos[2].y);
  }
  else {
    local_c8 = (long)left * 2 + cpos[0].y * -3 + cpos[2].y;
  }
  if (local_c8 < 0x10) {
    if (cpos[0].x * 2 + cpos[1].x * -3 + cpos[3].x < 0) {
      local_d0 = -(cpos[0].x * 2 + cpos[1].x * -3 + cpos[3].x);
    }
    else {
      local_d0 = cpos[0].x * 2 + cpos[1].x * -3 + cpos[3].x;
    }
    if (local_d0 < 0x10) {
      if ((long)left + cpos[2].y * 2 + cpos[1].y * -3 < 0) {
        local_d8 = -((long)left + cpos[2].y * 2 + cpos[1].y * -3);
      }
      else {
        local_d8 = (long)left + cpos[2].y * 2 + cpos[1].y * -3;
      }
      if (local_d8 < 0x10) {
        if (cpos[0].x + cpos[2].x * -3 + cpos[3].x * 2 < 0) {
          local_e0 = -(cpos[0].x + cpos[2].x * -3 + cpos[3].x * 2);
        }
        else {
          local_e0 = cpos[0].x + cpos[2].x * -3 + cpos[3].x * 2;
        }
        if (local_e0 < 0x10) {
          split_cubic((FT_26D6_Vec *)&left);
          goto LAB_003246d9;
        }
      }
    }
  }
  split_cubic((FT_26D6_Vec *)&left);
  if (2 < max_splits) {
    FVar1 = split_sdf_cubic(memory,(FT_26D6_Vec *)&left,max_splits >> 1,out);
    if (FVar1 != 0) {
      return FVar1;
    }
    FVar1 = split_sdf_cubic(memory,(FT_26D6_Vec *)&cpos[2].y,max_splits >> 1,out);
    return FVar1;
  }
LAB_003246d9:
  local_2c = sdf_edge_new(memory,&right);
  if ((local_2c == 0) && (local_2c = sdf_edge_new(memory,&stack0xffffffffffffff48), local_2c == 0))
  {
    (right->start_pos).x = (FT_Pos)left;
    (right->start_pos).y = cpos[0].x;
    (right->end_pos).x = cpos[2].y;
    (right->end_pos).y = cpos[3].x;
    right->edge_type = SDF_EDGE_LINE;
    (pSStack_b8->start_pos).x = cpos[2].y;
    (pSStack_b8->start_pos).y = cpos[3].x;
    (pSStack_b8->end_pos).x = cpos[5].y;
    (pSStack_b8->end_pos).y = cpos[6].x;
    pSStack_b8->edge_type = SDF_EDGE_LINE;
    right->next = pSStack_b8;
    pSStack_b8->next = *out;
    *out = right;
  }
  return local_2c;
}

Assistant:

static FT_Error
  split_sdf_cubic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error       error = FT_Err_Ok;
    FT_26D6_Vec    cpos[7];
    SDF_Edge*      left, *right;
    const FT_26D6  threshold = ONE_PIXEL / 4;


    if ( !memory || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split the cubic */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];
    cpos[3] = control_points[3];

    /* If the segment is flat enough we won't get any benefit by */
    /* splitting it further, so we can just stop splitting.      */
    /*                                                           */
    /* Check the deviation of the Bezier curve and stop if it is */
    /* smaller than the pre-defined `threshold` value.           */
    if ( FT_ABS( 2 * cpos[0].x - 3 * cpos[1].x + cpos[3].x ) < threshold &&
         FT_ABS( 2 * cpos[0].y - 3 * cpos[1].y + cpos[3].y ) < threshold &&
         FT_ABS( cpos[0].x - 3 * cpos[2].x + 2 * cpos[3].x ) < threshold &&
         FT_ABS( cpos[0].y - 3 * cpos[2].y + 2 * cpos[3].y ) < threshold )
    {
      split_cubic( cpos );
      goto Append;
    }

    split_cubic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_cubic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_cubic( memory, &cpos[3], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left) );
    FT_CALL( sdf_edge_new( memory, &right) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[3];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[3];
    right->end_pos   = cpos[6];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }